

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
count_freqs(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
           uint32_t *ibuff,size_t isize,size_t *maxv)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  size_t i;
  size_t sVar4;
  uint uVar5;
  size_t j;
  ulong uVar6;
  ulong uVar7;
  allocator_type local_49;
  size_t *local_48;
  uint32_t *local_40;
  value_type local_34;
  
  local_34 = 0;
  local_48 = maxv;
  local_40 = ibuff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,0x400,&local_34,&local_49);
  uVar7 = 0;
  for (sVar4 = 0; sVar4 != isize; sVar4 = sVar4 + 1) {
    puVar2 = (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = local_40[sVar4] + 1;
    uVar3 = (ulong)uVar5;
    uVar6 = (long)(__return_storage_ptr__->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar2 >> 2;
    if (uVar6 <= uVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (__return_storage_ptr__,(ulong)(local_40[sVar4] + 2));
      puVar2 = (__return_storage_ptr__->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar1 = (__return_storage_ptr__->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (; uVar6 < (ulong)((long)puVar1 - (long)puVar2 >> 2); uVar6 = uVar6 + 1) {
        puVar2[uVar6] = 0;
      }
      puVar2 = (__return_storage_ptr__->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    if ((uint)uVar7 <= uVar5) {
      uVar7 = uVar3;
    }
    puVar2[uVar3] = puVar2[uVar3] + 1;
  }
  *local_48 = uVar7;
  uVar3 = 0;
  for (uVar6 = 1; uVar6 <= uVar7; uVar6 = uVar6 + 1) {
    uVar3 = uVar3 + (__return_storage_ptr__->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar6];
  }
  while (0x20000000000 < uVar3) {
    puVar2 = (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = 0;
    for (uVar6 = 1; uVar6 <= uVar7; uVar6 = uVar6 + 1) {
      uVar5 = puVar2[uVar6] + 1 >> 1;
      puVar2[uVar6] = uVar5;
      uVar3 = uVar3 + uVar5;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> count_freqs(
    const uint32_t* ibuff, size_t isize, size_t* maxv)
{
    uint32_t newmax = 0;
    std::vector<uint32_t> F(1024, 0);
    for (size_t i = 0; i < isize; i++) {
        uint32_t v = ibuff[i] + 1;
        if (v >= F.size()) {
            auto cur_size = F.size();
            F.resize(v + 1);
            for (size_t j = cur_size; j < F.size(); j++)
                F[j] = 0;
        }
        newmax = std::max(newmax, v);
        F[v]++;
    }
    *maxv = newmax;
    size_t total = 0;
    for (uint32_t i = 1; i <= newmax; i++) {
        total += F[i];
    }

    /* now downsample the frequency array if required, to ensure that
       total size is less than 2^28
    */
    while (total > MINR) {
        total = 0;
        for (uint32_t i = 1; i <= newmax; i++) {
            F[i] = (F[i] + 1) >> 1;
            total += F[i];
        }
    }
    /* return the array that got constructed */
    return F;
}